

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

void anon_unknown.dwarf_277cd9::CleanupFunction(string *namespaceName)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)namespaceName);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)namespaceName);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)namespaceName);
      if (iVar1 != 0) {
        return;
      }
    }
  }
  simd::EnableSimd(true);
  return;
}

Assistant:

void CleanupFunction(const std::string& namespaceName)
    {
        if ( (namespaceName == "image_function_avx") || (namespaceName == "image_function_sse") || (namespaceName == "image_function_neon") )
            simd::EnableSimd( true );
    }